

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_send_and_recv(connectdata *conn,void **msg)

{
  size_t *psVar1;
  int *piVar2;
  size_t sVar3;
  Curl_easy *pCVar4;
  curl_slist *pcVar5;
  uint uVar6;
  unsigned_short uVar7;
  CURLcode CVar8;
  size_t in_RAX;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  size_t nread;
  size_t local_28;
  
  sVar12 = (conn->proto).ftpc.pp.response.tv_sec;
  local_28 = in_RAX;
  if (sVar12 == 0) {
    uVar9 = (conn->proto).smbc.upload_size;
    if (uVar9 == 0) goto LAB_00490c9e;
    pCVar4 = conn->data;
    local_28 = (pCVar4->set).upload_buffer_size;
    if (uVar9 < local_28) {
      local_28 = uVar9;
    }
    (pCVar4->req).upload_fromhere = (pCVar4->state).ulbuf;
    CVar8 = Curl_fillreadbuffer(conn,local_28,&local_28);
    if ((CVar8 != CURLE_AGAIN) && (CVar8 != CURLE_OK)) {
      return CVar8;
    }
    if (local_28 == 0) {
      return CURLE_OK;
    }
    psVar1 = &(conn->proto).ftpc.pp.sendsize;
    *psVar1 = *psVar1 - local_28;
    (conn->proto).smbc.send_size = local_28;
    *(undefined8 *)&(conn->proto).ftpc.pp.response.tv_usec = 0;
    sVar12 = local_28;
  }
  sVar3 = (conn->proto).smbc.sent;
  sVar12 = sVar12 - sVar3;
  CVar8 = Curl_write(conn,0,(conn->data->state).ulbuf + sVar3,sVar12,(ssize_t *)&local_28);
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
  if (local_28 == sVar12) {
    (conn->proto).ftpc.pp.response.tv_sec = 0;
  }
  else {
    piVar2 = &(conn->proto).ftpc.pp.response.tv_usec;
    *(size_t *)piVar2 = *(long *)piVar2 + local_28;
    if ((conn->proto).ftpc.pp.response.tv_sec != 0) {
      return CURLE_AGAIN;
    }
  }
LAB_00490c9e:
  if ((conn->proto).ftpc.pp.sendsize != 0) {
    return CURLE_AGAIN;
  }
  pcVar5 = (conn->proto).sshc.quote_item;
  sVar12 = (conn->proto).smbc.got;
  CVar8 = Curl_read(conn,0,(char *)((long)&pcVar5->data + sVar12),0x9000 - sVar12,
                    (ssize_t *)&local_28);
  if (CVar8 == CURLE_OK) {
    if ((local_28 != 0) &&
       (uVar9 = local_28 + (conn->proto).ftpc.pp.response_time,
       (conn->proto).ftpc.pp.response_time = uVar9, 3 < uVar9)) {
      uVar7 = Curl_read16_be((uchar *)((long)&pcVar5->data + 2));
      if ((ulong)uVar7 + 4 <= (ulong)(conn->proto).ftpc.pp.response_time) {
        if (0x20 < uVar7) {
          uVar6 = (uint)*(byte *)((long)&pcVar5[2].data + 4) * 2;
          uVar11 = uVar6 + 0x27;
          uVar10 = (uint)((ulong)uVar7 + 4);
          if ((uVar11 <= uVar10) &&
             (uVar7 = Curl_read16_le((uchar *)((long)&pcVar5[2].data + (ulong)uVar6 + 5)),
             uVar10 < uVar11 + uVar7)) {
            return CURLE_READ_ERROR;
          }
        }
        *msg = pcVar5;
      }
    }
    return CURLE_OK;
  }
  return CVar8;
}

Assistant:

static CURLcode smb_send_and_recv(struct connectdata *conn, void **msg)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > conn->data->set.upload_buffer_size ?
      conn->data->set.upload_buffer_size :
      smbc->upload_size;
    conn->data->req.upload_fromhere = conn->data->state.ulbuf;
    result = Curl_fillreadbuffer(conn, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(conn);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(conn, msg);
}